

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O1

void __thiscall QToolButton::mousePressEvent(QToolButton *this,QMouseEvent *e)

{
  long lVar1;
  char cVar2;
  undefined4 uVar3;
  uint uVar4;
  QStyle *pQVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar9 [16];
  QStyleOptionToolButton opt;
  ulong local_e0;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  QStyleOptionToolButton local_c0;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractButton).super_QWidget.field_0x8;
  memset(&local_c0,0xaa,0x98);
  QStyleOptionToolButton::QStyleOptionToolButton(&local_c0);
  (**(code **)(*(long *)&(this->super_QAbstractButton).super_QWidget + 0x1b8))(this,&local_c0);
  auVar9._8_8_ = uStack_d0;
  auVar9._0_8_ = local_d8;
  if ((*(int *)(e + 0x40) == 1) && (_local_d8 = auVar9, *(int *)(lVar1 + 0x2e8) == 1)) {
    local_d8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    uStack_d0 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar5 = QWidget::style((QWidget *)this);
    _local_d8 = (**(code **)(*(long *)pQVar5 + 0xd8))(pQVar5,4,&local_c0,2,this);
    if ((local_d8._0_4_ <= local_d8._8_4_) && ((int)local_d8._4_4_ <= uStack_d0._4_4_)) {
      uVar3 = QEventPoint::position();
      auVar7._0_8_ = (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                     extraout_XMM1_Qa;
      auVar7._8_8_ = (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                     extraout_XMM0_Qa;
      auVar9 = minpd(_DAT_0066f5d0,auVar7);
      auVar8._8_8_ = -(ulong)(-2147483648.0 < auVar9._8_8_);
      auVar8._0_8_ = -(ulong)(-2147483648.0 < auVar9._0_8_);
      uVar4 = movmskpd(uVar3,auVar8);
      uVar6 = 0x8000000000000000;
      if ((uVar4 & 1) != 0) {
        uVar6 = (ulong)(uint)(int)auVar9._0_8_ << 0x20;
      }
      local_e0 = 0x80000000;
      if ((uVar4 & 2) != 0) {
        local_e0 = (ulong)(uint)(int)auVar9._8_8_;
      }
      local_e0 = local_e0 | uVar6;
      cVar2 = QRect::contains((QPoint *)local_d8,SUB81(&local_e0,0));
      if (cVar2 != '\0') {
        *(byte *)(lVar1 + 0x2ec) = (*(byte *)(lVar1 + 0x2ec) & 0xfc) + 1;
        showMenu(this);
        goto LAB_004c3819;
      }
    }
  }
  *(byte *)(lVar1 + 0x2ec) = *(byte *)(lVar1 + 0x2ec) & 0xfc | 2;
  QAbstractButton::mousePressEvent(&this->super_QAbstractButton,e);
LAB_004c3819:
  QFont::~QFont(&local_c0.font);
  if (&(local_c0.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c0.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c0.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c0.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c0.text.d.d)->super_QArrayData,2,0x10);
    }
  }
  QIcon::~QIcon(&local_c0.icon);
  QStyleOption::~QStyleOption((QStyleOption *)&local_c0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolButton::mousePressEvent(QMouseEvent *e)
{
    Q_D(QToolButton);
#if QT_CONFIG(menu)
    QStyleOptionToolButton opt;
    initStyleOption(&opt);
    if (e->button() == Qt::LeftButton && (d->popupMode == MenuButtonPopup)) {
        QRect popupr = style()->subControlRect(QStyle::CC_ToolButton, &opt,
                                               QStyle::SC_ToolButtonMenu, this);
        if (popupr.isValid() && popupr.contains(e->position().toPoint())) {
            d->buttonPressed = QToolButtonPrivate::MenuButtonPressed;
            showMenu();
            return;
        }
    }
#endif
    d->buttonPressed = QToolButtonPrivate::ToolButtonPressed;
    QAbstractButton::mousePressEvent(e);
}